

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  uint uVar8;
  ImU32 IVar9;
  GetterYs<unsigned_int> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  GetterYRef *pGVar13;
  ImDrawVert *pIVar14;
  uint *puVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar16 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar7 = pGVar10->Count;
  uVar8 = *(uint *)((long)pGVar10->Ys +
                   (long)(((prim + pGVar10->Offset) % iVar7 + iVar7) % iVar7) *
                   (long)pGVar10->Stride);
  dVar22 = log10((pGVar10->XScale * (double)prim + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar12 = pIVar16->CurrentPlot;
  dVar3 = (pIVar12->XAxis).Range.Min;
  dVar4 = (pIVar12->XAxis).Range.Max;
  dVar23 = log10((double)uVar8 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar16->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar7].Range.Min;
  fVar24 = (float)((((double)(float)(dVar22 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar12->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar7].Min.x);
  fVar19 = (float)((((double)(float)(dVar23 / pIVar16->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar7] + (double)pIVar16->PixelRange[iVar7].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  dVar2 = pGVar13->YRef;
  dVar22 = log10(((double)prim * pGVar13->XScale + pGVar13->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar12 = pIVar17->CurrentPlot;
  dVar4 = (pIVar12->XAxis).Range.Min;
  dVar5 = (pIVar12->XAxis).Range.Max;
  dVar23 = log10(dVar2 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar17->CurrentPlot;
  dVar2 = pIVar12->YAxis[iVar7].Range.Min;
  fVar25 = (float)((((double)(float)(dVar22 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar12->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar7].Min.x);
  fVar26 = (float)((((double)(float)(dVar23 / pIVar17->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar17->My[iVar7] + (double)pIVar17->PixelRange[iVar7].Min.y);
  fVar20 = fVar19;
  if (fVar26 <= fVar19) {
    fVar20 = fVar26;
  }
  bVar18 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar26 <= fVar19) & (uint)fVar26 |
                      -(uint)(fVar26 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar24;
    if (fVar25 <= fVar24) {
      fVar20 = fVar25;
    }
    bVar18 = false;
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar25 <= fVar24) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar24) & (uint)fVar24);
      bVar18 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar18 != false) {
    fVar20 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar27 = fVar25 - fVar24;
    fVar28 = fVar26 - fVar19;
    fVar21 = fVar27 * fVar27 + fVar28 * fVar28;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar27 = fVar27 * (1.0 / fVar21);
      fVar28 = fVar28 * (1.0 / fVar21);
    }
    fVar20 = fVar20 * 0.5;
    fVar27 = fVar27 * fVar20;
    fVar20 = fVar20 * fVar28;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar20 + fVar24;
    (pIVar14->pos).y = fVar19 - fVar27;
    pIVar14->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar20 + fVar25;
    pIVar14[1].pos.y = fVar26 - fVar27;
    pIVar14[1].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar25 - fVar20;
    pIVar14[2].pos.y = fVar27 + fVar26;
    pIVar14[2].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = fVar24 - fVar20;
    pIVar14[3].pos.y = fVar27 + fVar19;
    pIVar14[3].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    puVar15 = DrawList->_IdxWritePtr;
    *puVar15 = DrawList->_VtxCurrentIdx;
    puVar15[1] = DrawList->_VtxCurrentIdx + 1;
    puVar15[2] = DrawList->_VtxCurrentIdx + 2;
    puVar15[3] = DrawList->_VtxCurrentIdx;
    puVar15[4] = DrawList->_VtxCurrentIdx + 2;
    puVar15[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar15 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }